

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipState.hpp
# Opt level: O1

void __thiscall
linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>::Init
          (SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>
           *this)

{
  int iVar1;
  ulong uVar2;
  
  this->current = 0;
  (**((this->source).source1.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->_vptr_IState)();
  (**((this->source).source2.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->_vptr_IState)();
  iVar1 = (*((this->source).source1.state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState
            [1])();
  (this->source).s1 = SUB41(iVar1,0);
  if (this->current < this->count) {
    do {
      if (((this->source).s1 == false) &&
         (iVar1 = (*((this->source).source2.state.
                     super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_IState[1])(), (char)iVar1 == '\0')) {
        return;
      }
      ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Advance(&this->source);
      uVar2 = this->current + 1;
      this->current = uVar2;
    } while (uVar2 < this->count);
  }
  return;
}

Assistant:

void Init() override final
			{
				current = 0;
				source.Init(); 
				
				while(current < count && source.Valid()) {
					source.Advance();
					current++;
				}
			}